

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O0

double PhPacker::__phpack__detail::php_pack_parse_double(int is_little_endian,char *src)

{
  double d;
  char out [8];
  char *src_local;
  int is_little_endian_local;
  
  out = (char  [8])src;
  memset(&d,0,8);
  if (is_little_endian == 0) {
    d._0_1_ = *(undefined1 *)((long)out + 7);
    d._1_1_ = *(undefined1 *)((long)out + 6);
    d._2_1_ = *(undefined1 *)((long)out + 5);
    d._3_1_ = *(undefined1 *)((long)out + 4);
    d._4_1_ = *(undefined1 *)((long)out + 3);
    d._5_1_ = *(undefined1 *)((long)out + 2);
    d._6_1_ = *(undefined1 *)((long)out + 1);
    d._7_1_ = *(undefined1 *)out;
  }
  else {
    d._0_1_ = *(undefined1 *)out;
    d._1_1_ = *(undefined1 *)((long)out + 1);
    d._2_1_ = *(undefined1 *)((long)out + 2);
    d._3_1_ = *(undefined1 *)((long)out + 3);
    d._4_1_ = *(undefined1 *)((long)out + 4);
    d._5_1_ = *(undefined1 *)((long)out + 5);
    d._6_1_ = *(undefined1 *)((long)out + 6);
    d._7_1_ = *(undefined1 *)((long)out + 7);
  }
  return (double)CONCAT17(d._7_1_,CONCAT16(d._6_1_,CONCAT15(d._5_1_,CONCAT14(d._4_1_,CONCAT13(d.
                                                  _3_1_,CONCAT12(d._2_1_,CONCAT11(d._1_1_,d._0_1_)))
                                                  ))));
}

Assistant:

double php_pack_parse_double(int is_little_endian, const char* src) noexcept
{
    char out[8] = {};
    if (!is_little_endian) {
        out[0] = src[7];
        out[1] = src[6];
        out[2] = src[5];
        out[3] = src[4];
        out[4] = src[3];
        out[5] = src[2];
        out[6] = src[1];
        out[7] = src[0];
    } else {
        out[0] = src[0];
        out[1] = src[1];
        out[2] = src[2];
        out[3] = src[3];
        out[4] = src[4];
        out[5] = src[5];
        out[6] = src[6];
        out[7] = src[7];
    }
    double d {};
    memcpy(&d, out, sizeof(double));

    return d;
}